

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O2

void __thiscall
HermiteSpline<5U,_2U>::walk
          (HermiteSpline<5U,_2U> *this,double deltatau,
          _func_void_VectorNd_HermiteSpline<5U,_2U>_ptr_double_Polynomial_ptr_void_ptr *fn,
          void *payload)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  pointer pUVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double in_XMM2_Qa;
  VectorNd VVar8;
  VectorNd VVar9;
  undefined1 local_58 [16];
  VectorNd pt;
  
  pUVar4 = (this->children).
           super__Vector_base<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar6 = 0.0;
  uVar3 = 0;
  while( true ) {
    uVar5 = (ulong)uVar3;
    if ((ulong)(((long)(this->children).
                       super__Vector_base<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar4) / 0x68) <= uVar5)
    break;
    dVar7 = dVar6 / pUVar4[uVar5].length;
    VVar8 = UnitBoundedPolynomial<5U,_2U>::interpolate((UnitBoundedPolynomial<5U,_2U> *)&pt,dVar7);
    VVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         VVar8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
         [1];
    local_58._0_8_ =
         pt.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0];
    local_58._8_8_ =
         pt.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1];
    VVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         dVar7;
    (*fn)(VVar9,(HermiteSpline<5U,_2U> *)local_58,in_XMM2_Qa,(Polynomial *)this,
          (this->children).
          super__Vector_base<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
          ._M_impl.super__Vector_impl_data._M_start + uVar5);
    dVar7 = dVar6 + deltatau;
    pUVar4 = (this->children).
             super__Vector_base<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar1 = dVar7 != pUVar4[uVar5].length;
    bVar2 = pUVar4[uVar5].length <= dVar7;
    dVar6 = 0.0;
    if (!bVar2 || !bVar1) {
      dVar6 = dVar7;
    }
    uVar3 = (bVar2 && bVar1) + uVar3;
  }
  return;
}

Assistant:

void HermiteSpline<Order, Dims>::walk(const double deltatau, void (*fn)(VectorNd, HermiteSpline<Order, Dims>&, double, UnitBoundedPolynomial<Order, Dims>&, void *), void *payload)
{
    double tau = 0.0;
    int m = 0;

    while (m < children.size())
    {
        double reltau = tau / children[m].length;
        VectorNd pt = children[m].interpolate(reltau);

        fn(pt, *this, reltau, children[m], payload);
        tau += deltatau;

        if (tau > children[m].length)
        {
            tau = 0.0;
            m++;
        }
    }
}